

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeedTest.cpp
# Opt level: O3

int64_t timehash_small(pfHash hash,void *key,int len,int seed)

{
  long lVar1;
  uint *__dest;
  void *pvVar2;
  long lVar3;
  undefined4 extraout_EDX;
  int iVar4;
  ulong uVar5;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  unsigned_long_long end;
  unsigned_long_long begin;
  uint32_t hash_temp [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar6 [16];
  
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  iVar4 = len + 6;
  if (-1 < len + 3) {
    iVar4 = len + 3;
  }
  uVar5 = 0xffffffffffffffff;
  if (-7 < len) {
    uVar5 = (long)(iVar4 >> 2) << 2;
  }
  __dest = (uint *)operator_new__(uVar5);
  pvVar2 = memcpy(__dest,key,(long)len);
  iVar4 = (int)pvVar2;
  if (iVar4 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar4 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar4 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar4 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar4 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar4 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar4 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar4 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar4 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar4 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar4 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar4 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar4 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar4 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar4 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar4 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar4);
  }
  lVar1 = rdtsc();
  iVar4 = 200;
  do {
    (*hash)(__dest,len,seed,&local_78);
    auVar6._8_8_ = extraout_XMM1_Qb;
    auVar6._0_8_ = extraout_XMM1_Qa;
    *__dest = *__dest ^ (uint)local_78;
    seed = seed + (uint)local_78;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  rdtscp();
  if ((uint)local_78 == 0) {
    cpuid_basic_info(0);
  }
  else if ((uint)local_78 == 1) {
    cpuid_Version_info(1);
  }
  else if ((uint)local_78 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if ((uint)local_78 == 3) {
    cpuid_serial_info(3);
  }
  else if ((uint)local_78 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if ((uint)local_78 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if ((uint)local_78 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if ((uint)local_78 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if ((uint)local_78 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if ((uint)local_78 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if ((uint)local_78 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if ((uint)local_78 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if ((uint)local_78 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if ((uint)local_78 == 0x80000002) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if ((uint)local_78 == 0x80000003) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if ((uint)local_78 == 0x80000004) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid((uint)local_78);
  }
  lVar3 = CONCAT44(extraout_EDX,(uint)local_78);
  operator_delete__(__dest);
  auVar6 = vcvtusi2sd_avx512f(auVar6,lVar3 - lVar1);
  return (long)(auVar6._0_8_ / 200.0);
}

Assistant:

NEVER_INLINE int64_t timehash_small ( pfHash hash, const void * key, int len, int seed )
{
  const int NUM_TRIALS = 200;
  volatile unsigned long long int begin, end;
  uint32_t hash_temp[16] = {};
  uint32_t *buf = new uint32_t[(len + 3) / 4];
  memcpy(buf,key,len);

  begin = timer_start();

  for(int i = 0; i < NUM_TRIALS; i++) {
    hash(buf,len,seed,hash_temp);
    // XXX Add dependency between invocations of hash-function to prevent parallel
    // evaluation of them. However this way the invocations still would not be
    // fully serialized. Another option is to use lfence instruction (load-from-memory
    // serialization instruction) or mfence (load-from-memory AND store-to-memory
    // serialization instruction):
    //   __asm volatile ("lfence");
    // It's hard to say which one is the most realistic and sensible approach.
    seed += hash_temp[0];
    buf[0] ^= hash_temp[0];
  }

  end = timer_end();
  delete[] buf;

  return (int64_t)((end - begin) / (double)NUM_TRIALS);
}